

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O0

void QSharedPointer<ocsp_response_st>::deref(Data *dd)

{
  bool bVar1;
  ExternalRefCountData *in_RDI;
  
  if (in_RDI != (ExternalRefCountData *)0x0) {
    bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x15ab35);
    if (!bVar1) {
      QtSharedPointer::ExternalRefCountData::destroy((ExternalRefCountData *)0x15ab43);
    }
    bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x15ab4d);
    if ((!bVar1) && (in_RDI != (ExternalRefCountData *)0x0)) {
      QtSharedPointer::ExternalRefCountData::~ExternalRefCountData(in_RDI);
      QtSharedPointer::ExternalRefCountData::operator_delete((void *)0x15ab75);
    }
  }
  return;
}

Assistant:

static void deref(Data *dd) noexcept
    {
        if (!dd) return;
        if (!dd->strongref.deref()) {
            dd->destroy();
        }
        if (!dd->weakref.deref())
            delete dd;
    }